

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall
UniValue::getObjMap(UniValue *this,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                   *kv)

{
  pointer pbVar1;
  pointer pUVar2;
  mapped_type *this_00;
  size_t i;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if (this->typ == VOBJ) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)kv);
    lVar4 = 0;
    lVar5 = 0;
    for (uVar3 = 0;
        pbVar1 = (this->keys).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->keys).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar3 = uVar3 + 1) {
      pUVar2 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                ::operator[](kv,(key_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
      operator=(this_00,(UniValue *)((long)&pUVar2->typ + lVar4));
      lVar5 = lVar5 + 0x20;
      lVar4 = lVar4 + 0x58;
    }
  }
  return;
}

Assistant:

void UniValue::getObjMap(std::map<std::string,UniValue>& kv) const
{
    if (typ != VOBJ)
        return;

    kv.clear();
    for (size_t i = 0; i < keys.size(); i++)
        kv[keys[i]] = values[i];
}